

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O1

void __thiscall AllFloatsRoundtripTest::RunShard(AllFloatsRoundtripTest *this,int shard)

{
  LiteralType literal_type;
  size_t sVar1;
  int line;
  undefined4 in_register_00000034;
  ulong uVar2;
  char *message;
  uint uVar3;
  bool bVar4;
  AssertionResult gtest_ar;
  uint32_t new_bits;
  char buffer [100];
  uint local_cc;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  uint local_bc;
  internal local_b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  AssertHelper local_a8;
  uint32_t local_9c;
  char local_98 [104];
  
  uVar2 = CONCAT44(in_register_00000034,shard);
  local_bc = 0xffffffff;
  local_cc = shard;
  while( true ) {
    if ((shard == 0) && (uVar3 = (uint)(uVar2 >> 0x18) & 0xff, uVar3 != local_bc)) {
      printf("value: 0x%08x (%d%%)\r",uVar2,
             (ulong)(uint)(int)(((double)(uVar2 & 0xffffffff) * 100.0) / 4294967295.0));
      fflush(_stdout);
      local_bc = uVar3;
    }
    wabt::WriteFloatHex(local_98,100,local_cc);
    sVar1 = strlen(local_98);
    local_c8.ptr_ = local_c8.ptr_ & 0xffffffff00000000;
    literal_type = Nan - ((local_cc & 0x7fffff) == 0);
    if ((~local_cc & 0x7f800000) != 0) {
      literal_type = Hexfloat;
    }
    local_a8.data_._0_4_ = wabt::ParseFloat(literal_type,local_98,local_98 + (int)sVar1,&local_9c);
    testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
              (local_b8,"Result::Ok",
               "ParseFloat(ClassifyFloat(bits), buffer, buffer + len, &new_bits)",(Enum *)&local_c8,
               (Result *)&local_a8);
    if (local_b8[0] == (internal)0x0) break;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_b8,"new_bits","bits",&local_9c,&local_cc);
    if (local_b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_c8);
      if (local_b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        message = "";
      }
      else {
        message = ((local_b0.ptr_)->_M_dataplus)._M_p;
      }
      line = 0xa9;
      goto LAB_0011f81a;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar3 = (this->super_ThreadedTest).num_threads_;
    bVar4 = CARRY4(uVar3,local_cc);
    local_cc = uVar3 + local_cc;
    uVar2 = (ulong)local_cc;
    if (bVar4) {
      if (shard == 0) {
        puts("done.");
        fflush(_stdout);
      }
      return;
    }
  }
  testing::Message::Message((Message *)&local_c8);
  if (local_b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((local_b0.ptr_)->_M_dataplus)._M_p;
  }
  line = 0xa8;
LAB_0011f81a:
  testing::internal::AssertHelper::AssertHelper
            (&local_a8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-hexfloat.cc"
             ,line,message);
  testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c8);
  testing::internal::AssertHelper::~AssertHelper(&local_a8);
  if (local_c8.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) &&
       (local_c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_c8.ptr_ + 8))();
    }
    local_c8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(bits) {
      LOG_COMPLETION(bits);
      WriteFloatHex(buffer, sizeof(buffer), bits);
      int len = strlen(buffer);

      uint32_t new_bits;
      ASSERT_EQ(Result::Ok, ParseFloat(ClassifyFloat(bits), buffer,
                                       buffer + len, &new_bits));
      ASSERT_EQ(new_bits, bits);
    }
    LOG_DONE();
  }